

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O2

NodeKey * Clasp::Cli::getNode(NodeKey *__return_storage_ptr__,int16 id)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  ushort uVar4;
  int16 iVar5;
  uint16 uVar6;
  
  uVar4 = id + 5;
  if (uVar4 < 0x4e) {
    uVar1 = (uint)uVar4 * 4;
    pcVar2 = &DAT_001990a8 + *(int *)(&DAT_001990a8 + uVar1);
    pcVar3 = &DAT_001991e0 + *(int *)(&DAT_001991e0 + uVar1);
    uVar1 = (uint)uVar4 * 2;
    iVar5 = *(int16 *)(&DAT_00199318 + uVar1);
    uVar6 = *(uint16 *)(&DAT_001993b4 + uVar1);
  }
  else {
    pcVar2 = "";
    iVar5 = 0;
    pcVar3 = "";
    uVar6 = 0;
  }
  __return_storage_ptr__->name = pcVar2;
  __return_storage_ptr__->desc = pcVar3;
  __return_storage_ptr__->skBeg = iVar5;
  __return_storage_ptr__->skSize = uVar6;
  return __return_storage_ptr__;
}

Assistant:

static NodeKey getNode(int16 id) {
	assert(isValidId(id));
	switch(id) {
		case key_root  : return makeNode("", "Options", key_tester, option_category_global_end);
		case key_tester: return makeNode("tester", "Tester Options", key_solver, option_category_context_end);
		case key_solve : return makeNode("solve", "Solve Options", option_category_solve_begin, option_category_solve_end);
		case key_asp   : return makeNode("asp", "Asp Options", option_category_asp_begin, option_category_asp_end);
		case key_solver: return makeNode("solver", "Solver Options", option_category_solver_begin, option_category_search_end);
		case key_leaf  : return makeNode("configuration", KEY_INIT_DESC("Initializes this configuration\n"));
		#define OPTION(k, e, a, d, x, v) case opt_##k: return makeNode(#k, d);
		#define CLASP_ALL_GROUPS
		#include <clasp/cli/clasp_cli_options.inl>
		default        : return makeNode("", "");
	}
}